

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall rtosc::Ports::dispatch(Ports *this,char *m,RtData *d,bool base_dispatch)

{
  int iVar1;
  bool bVar2;
  _Bool _Var3;
  reference piVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  bool *pbVar8;
  char *pcVar9;
  long lVar10;
  byte in_CL;
  long in_RDX;
  char *in_RSI;
  Port_Matcher *in_RDI;
  char *pos_1;
  char *msg_1;
  Port *port_2;
  int port_num;
  int p;
  iterator __end3;
  iterator __begin3;
  ivec_t *__range3;
  int t;
  char *tmp_1;
  uint len;
  char *tmp;
  char *pos;
  char *msg;
  char *m_end;
  Port *port_1;
  uint i;
  char *old_end;
  Port *port;
  const_iterator __end2;
  const_iterator __begin2;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  void *obj;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  RtData *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff18;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar12;
  undefined4 in_stack_ffffffffffffff20;
  int iVar13;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 uVar14;
  undefined1 in_stack_ffffffffffffff27;
  char *local_d0;
  char *local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  pointer local_a0;
  int local_94;
  char *local_90;
  int local_84;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  const_reference local_60;
  uint local_54;
  char *local_50;
  reference local_48;
  Port *local_40;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  local_38 [2];
  undefined8 local_28;
  byte local_19;
  long local_18;
  char *local_10;
  
  local_19 = in_CL & 1;
  local_28 = *(undefined8 *)(in_RDX + 0x18);
  local_10 = in_RSI;
  if (local_19 != 0) {
    *(undefined4 *)(in_RDX + 0x20) = 0;
    *(char **)(in_RDX + 0x30) = in_RSI;
    if ((in_RSI != (char *)0x0) && (*in_RSI == '/')) {
      local_10 = in_RSI + 1;
    }
    if (*(long *)(in_RDX + 8) != 0) {
      **(undefined1 **)(in_RDX + 8) = 0;
    }
  }
  local_18 = in_RDX;
  if ((*(long *)(in_RDX + 8) == 0) || (*(long *)(in_RDX + 0x10) == 0)) {
    local_38[0]._M_current =
         (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::begin
                           ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)
                            in_stack_ffffffffffffff08);
    local_40 = (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::end
                                 ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)
                                  in_stack_ffffffffffffff08);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                               *)in_stack_ffffffffffffff08), bVar2) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                 ::operator*(local_38);
      _Var3 = rtosc_match((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
      if (_Var3) {
        *(reference *)(local_18 + 0x28) = local_48;
        std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
                  ((function<void_(const_char_*,_rtosc::RtData_&)> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)))
                   ,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff10);
        *(undefined8 *)(local_18 + 0x18) = local_28;
      }
      __gnu_cxx::
      __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
      ::operator++(local_38);
    }
  }
  else {
    if (**(char **)(in_RDX + 8) == '\0') {
      memset(*(void **)(in_RDX + 8),0,*(size_t *)(in_RDX + 0x10));
      **(undefined1 **)(local_18 + 8) = 0x2f;
    }
    for (local_50 = *(char **)(local_18 + 8); *local_50 != '\0'; local_50 = local_50 + 1) {
    }
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT24(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20))));
    if (bVar2) {
      for (local_54 = 0;
          local_54 <
          *(uint *)&(in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; local_54 = local_54 + 1) {
        local_60 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[]
                             ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)in_RDI,
                              (ulong)local_54);
        _Var3 = rtosc_match((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
        if (_Var3) {
          if (local_60->ports == (Ports *)0x0) {
            *(int *)(local_18 + 0x20) = *(int *)(local_18 + 0x20) + 1;
          }
          pcVar9 = strchr(local_60->name,0x23);
          if (pcVar9 == (char *)0x0) {
            scat(*(char **)(local_18 + 8),local_60->name);
          }
          else {
            local_70 = local_10;
            local_78 = local_50;
            while (in_stack_ffffffffffffff27 = *local_70 != '\0' && local_70 != local_68,
                  *local_70 != '\0' && local_70 != local_68) {
              *local_78 = *local_70;
              local_78 = local_78 + 1;
              local_70 = local_70 + 1;
            }
            *local_78 = '\0';
          }
          *(const_reference *)(local_18 + 0x28) = local_60;
          std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
                    ((function<void_(const_char_*,_rtosc::RtData_&)> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                                      )),
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10);
          *(undefined8 *)(local_18 + 0x18) = local_28;
          local_80 = local_50;
          while (*local_80 != '\0') {
            *local_80 = '\0';
            local_80 = local_80 + 1;
          }
        }
      }
    }
    else {
      local_90 = local_10;
      while( true ) {
        uVar14 = false;
        if (*local_90 != '\0') {
          uVar14 = *local_90 != '/';
        }
        if ((bool)uVar14 == false) break;
        local_90 = local_90 + 1;
      }
      if (*local_90 == '/') {
        local_90 = local_90 + 1;
      }
      local_94 = (int)local_90 - (int)local_10;
      local_a0 = (in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 0xe;
      local_84 = local_94;
      local_a8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
      std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff08);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffff10,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffff08), bVar2) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_a8);
        if (*piVar4 < local_84) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              ((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x14),(long)local_10[*piVar4]);
          local_94 = *pvVar6 + local_94;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_a8);
      }
      iVar13 = local_94;
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         ((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x1a));
      if ((iVar13 < (int)sVar5) ||
         (bVar2 = std::function::operator_cast_to_bool
                            ((function<void_(const_char_*,_rtosc::RtData_&)> *)0x1055a8), bVar2)) {
        iVar12 = local_94;
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           ((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x1a));
        if ((iVar12 < (int)sVar5) ||
           (bVar2 = std::function::operator_cast_to_bool
                              ((function<void_(const_char_*,_rtosc::RtData_&)> *)0x1055e4), !bVar2))
        {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              ((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x1a),(long)local_94);
          iVar1 = *pvVar6;
          bVar2 = Port_Matcher::hard_match
                            (in_RDI,CONCAT13(in_stack_ffffffffffffff27,
                                             CONCAT12(uVar14,in_stack_ffffffffffffff24)),
                             (char *)CONCAT44(iVar12,in_stack_ffffffffffffff18));
          if (bVar2) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                ((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start + 0x1a),(long)local_94);
            pvVar7 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[]
                               ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)in_RDI,
                                (long)*pvVar6);
            if (pvVar7->ports == (Ports *)0x0) {
              *(int *)(local_18 + 0x20) = *(int *)(local_18 + 0x20) + 1;
            }
            pbVar8 = Port_Matcher::enump((Port_Matcher *)
                                         (in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            if ((pbVar8[iVar1] & 1U) == 0) {
              pcVar9 = local_50;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 2),(long)iVar1);
              in_stack_ffffffffffffff10 = (RtData *)std::__cxx11::string::c_str();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((in_RDI->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 2),(long)iVar1);
              lVar10 = std::__cxx11::string::length();
              memcpy(pcVar9,in_stack_ffffffffffffff10,lVar10 + 1);
            }
            else {
              local_c8 = local_10;
              local_d0 = local_50;
              uVar11 = in_stack_ffffffffffffff18;
              while( true ) {
                in_stack_ffffffffffffff18 = uVar11 & 0xffffff;
                if (*local_c8 != '\0') {
                  in_stack_ffffffffffffff18 = CONCAT13(*local_c8 != '/',(int3)uVar11);
                }
                if ((char)(in_stack_ffffffffffffff18 >> 0x18) == '\0') break;
                *local_d0 = *local_c8;
                uVar11 = in_stack_ffffffffffffff18;
                local_d0 = local_d0 + 1;
                local_c8 = local_c8 + 1;
              }
              pcVar9 = strchr(pvVar7->name,0x2f);
              if (pcVar9 != (char *)0x0) {
                *local_d0 = '/';
                local_d0 = local_d0 + 1;
              }
              *local_d0 = '\0';
            }
            *(const_reference *)(local_18 + 0x28) = pvVar7;
            std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
                      ((function<void_(const_char_*,_rtosc::RtData_&)> *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(uVar14,CONCAT24(in_stack_ffffffffffffff24,iVar13))),
                       (char *)CONCAT44(iVar12,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10)
            ;
            *(undefined8 *)(local_18 + 0x18) = local_28;
            *local_50 = '\0';
          }
          else {
            bVar2 = std::function::operator_cast_to_bool
                              ((function<void_(const_char_*,_rtosc::RtData_&)> *)0x105843);
            if (bVar2) {
              *(int *)(local_18 + 0x20) = *(int *)(local_18 + 0x20) + 1;
              std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
                        ((function<void_(const_char_*,_rtosc::RtData_&)> *)
                         CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(uVar14,CONCAT24(in_stack_ffffffffffffff24,iVar13))),
                         (char *)CONCAT44(iVar12,in_stack_ffffffffffffff18),
                         in_stack_ffffffffffffff10);
              *(undefined8 *)(local_18 + 0x18) = local_28;
            }
          }
        }
        else {
          *(int *)(local_18 + 0x20) = *(int *)(local_18 + 0x20) + 1;
          std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
                    ((function<void_(const_char_*,_rtosc::RtData_&)> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(uVar14,CONCAT24(in_stack_ffffffffffffff24,iVar13))),
                     (char *)CONCAT44(iVar12,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10);
          *(undefined8 *)(local_18 + 0x18) = local_28;
        }
      }
    }
  }
  return;
}

Assistant:

void Ports::dispatch(const char *m, rtosc::RtData &d, bool base_dispatch) const
{
    // rRecur*Cb have already set d.loc to the required pointer
    // in case no port will match, d.loc will not be touched
    // this enables returning the address of a runtime object

    void *obj = d.obj;

    //handle the first dispatch layer
    if(base_dispatch) {
        d.matches = 0;
        d.message = m;
        if(m && *m == '/')
            m++;
        if(d.loc)
            d.loc[0] = 0;
    }

    //simple case
    if(!d.loc || !d.loc_size) {
        for(const Port &port: ports) {
            if(rtosc_match(port.name,m, NULL))
                d.port = &port, port.cb(m,d), d.obj = obj;
        }
    } else {

        //TODO this function is certainly buggy at the moment, some tests
        //are needed to make it clean
        //XXX buffer_size is not properly handled yet
        if(__builtin_expect(d.loc[0] == 0, 0)) {
            memset(d.loc, 0, d.loc_size);
            d.loc[0] = '/';
        }

        char *old_end = d.loc;
        while(*old_end) ++old_end;

        if(impl->pos.empty()) { //No perfect minimal hash function
            for(unsigned i=0; i<elms; ++i) {
                const Port &port = ports[i];
                const char* m_end;
                if(!rtosc_match(port.name, m, &m_end))
                    continue;
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(strchr(port.name,'#')) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && msg != m_end)
                        *pos++ = *msg++;
                    *pos = '\0';
                } else
                    scat(d.loc, port.name);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                char *tmp = old_end;
                while(*tmp) *tmp++=0;
            }
        } else {

            //Define string to be hashed
            unsigned len=0;
            const char *tmp = m;

            while(*tmp && *tmp != '/')
                tmp++;
            if(*tmp == '/')
                tmp++;
            len = tmp-m;

            //Compute the hash
            int t = len;
            for(auto p:impl->pos)
                if(p < (int)len)
                    t += impl->assoc[m[p]];
            if(t >= (int)impl->remap.size() && !default_handler)
                return;
            else if(t >= (int)impl->remap.size() && default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
                return;
            }

            int port_num = impl->remap[t];

            //Verify the chosen port is correct
            if(__builtin_expect(impl->hard_match(port_num, m), 1)) {
                const Port &port = ports[impl->remap[t]];
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(impl->enump()[port_num]) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && *msg != '/')
                        *pos++ = *msg++;
                    if(strchr(port.name, '/'))
                        *pos++ = '/';
                    *pos = '\0';
                } else
                    memcpy(old_end, impl->fixed[port_num].c_str(),
                            impl->fixed[port_num].length()+1);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                old_end[0] = '\0';
            } else if(default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
            }
        }
    }
}